

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall video::src_format<37,48>(video *this,context *ctx,token *token,opcode *op)

{
  bool bVar1;
  long lVar2;
  optional<unsigned_long> oVar3;
  int local_ac;
  token local_a8;
  string_view local_80;
  _Storage<unsigned_long,_true> local_70;
  undefined1 local_68;
  string_view local_60;
  _Storage<unsigned_long,_true> local_50;
  undefined1 local_48;
  undefined1 local_40 [8];
  optional<long> result;
  bool is_signed;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._15_1_
       = 1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,".");
  oVar3 = find_in_table(token,src_format<37,_48>::signed_table,local_60);
  local_50._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_48 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  std::optional<long>::optional<unsigned_long,_true>
            ((optional<long> *)local_40,(optional<unsigned_long> *)&local_50);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_40);
  if (!bVar1) {
    result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _15_1_ = 0;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,".");
    oVar3 = find_in_table(token,src_format<37,_48>::unsigned_table,local_80);
    local_70._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_68 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    std::optional<long>::operator=((optional<long> *)local_40,(optional<unsigned_long> *)&local_70);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_40);
    if (!bVar1) {
      result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _15_1_ = 1;
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_40);
  if (bVar1) {
    context::tokenize(&local_a8,ctx);
    memcpy(token,&local_a8,0x24);
  }
  local_ac = 3;
  lVar2 = std::optional<long>::value_or<int>((optional<long> *)local_40,&local_ac);
  opcode::add_bits(op,lVar2 << 0x25);
  opcode::add_bits(op,(ulong)((result.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._15_1_ & 1) != 0) << 0x30);
  memset(this,0,8);
  error::error((error *)this);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(src_format)
    {
        static const char* signed_table[] = {"S8", "", "S16", "S32", nullptr};
        static const char* unsigned_table[] = {"U8", "", "U16", "U32", nullptr};
        bool is_signed = true;
        std::optional<int64_t> result = find_in_table(token, signed_table, ".");
        if (!result) {
            is_signed = false;
            result = find_in_table(token, unsigned_table, ".");
            if (!result) {
                is_signed = true;
            }
        }
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(3) << address); // .U32
        op.add_bits((is_signed ? 1ULL : 0ULL) << sign_address);
        return {};
    }